

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

void gdImageString16(gdImagePtr im,gdFontPtr f,int x,int y,unsigned_short *s,int color)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = strlen16(s);
  uVar3 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    gdImageChar(im,f,x,y,(uint)s[uVar3],color);
    x = x + f->w;
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageString16 (gdImagePtr im, gdFontPtr f,
								   int x, int y, unsigned short *s, int color)
{
	int i;
	int l;
	l = strlen16 (s);
	for (i = 0; (i < l); i++) {
		gdImageChar (im, f, x, y, s[i], color);
		x += f->w;
	}
}